

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Scope *pSVar1;
  Compilation *this_00;
  InstanceSymbol *this_01;
  bool bVar2;
  SymbolKind SVar3;
  Compilation *compilation;
  InvalidExpression *pIVar4;
  Diagnostic *this_02;
  Expression *pEVar5;
  char *func;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  SourceRange sourceRange;
  InvalidExpression *local_28;
  
  extraLookupFlags.m_bits = (underlying_type)args;
  if (argIndex == 0) {
    pEVar5 = SystemSubroutine::bindArgument((SystemSubroutine *)this,0,context,syntax,args);
    return pEVar5;
  }
  pSVar1 = (context->scope).ptr;
  if (pSVar1 != (Scope *)0x0) {
    this_00 = pSVar1->compilation;
    bVar2 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    if (!bVar2) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0xa000b,sourceRange);
      local_28 = (InvalidExpression *)0x0;
      pIVar4 = BumpAllocator::
               emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                         (&this_00->super_BumpAllocator,&local_28,this_00->errorType);
      return &pIVar4->super_Expression;
    }
    compilation = (Compilation *)
                  slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                            (&syntax->super_SyntaxNode);
    pIVar4 = (InvalidExpression *)
             HierarchicalReferenceExpression::fromSyntax
                       ((HierarchicalReferenceExpression *)this_00,compilation,(NameSyntax *)context
                        ,(ASTContext *)0x0,extraLookupFlags);
    if ((pIVar4->super_Expression).kind != HierarchicalReference) {
      return &pIVar4->super_Expression;
    }
    this_01 = (InstanceSymbol *)pIVar4->child;
    if (this_01 == (InstanceSymbol *)0x0) {
      func = 
      "T slang::not_null<const slang::ast::Symbol *>::get() const [T = const slang::ast::Symbol *]";
      goto LAB_00398ed5;
    }
    SVar3 = (this_01->super_InstanceSymbolBase).super_Symbol.kind;
    if (SVar3 - Net < 2) {
LAB_00398dc0:
      if (((SVar3 - Variable < 0x19) && ((0x1800c0fU >> (SVar3 - Variable & 0x1f) & 1) != 0)) &&
         (*(int *)&this_01[1].super_InstanceSymbolBase.super_Symbol.nextInScope == 0)) {
        this_02 = ASTContext::addDiag(context,(DiagCode)0x4000b,
                                      (pIVar4->super_Expression).sourceRange);
        Diagnostic::operator<<(this_02,(this_01->super_InstanceSymbolBase).super_Symbol.name);
      }
      return &pIVar4->super_Expression;
    }
    if ((SVar3 == Instance) && (bVar2 = InstanceSymbol::isModule(this_01), bVar2)) {
      SVar3 = (this_01->super_InstanceSymbolBase).super_Symbol.kind;
      goto LAB_00398dc0;
    }
    pSVar1 = (context->scope).ptr;
    if (pSVar1 != (Scope *)0x0) {
      bVar2 = Scope::isUninstantiated(pSVar1);
      if (!bVar2) {
        ASTContext::addDiag(context,(DiagCode)0xa000b,(pIVar4->super_Expression).sourceRange);
      }
      local_28 = pIVar4;
      pIVar4 = BumpAllocator::
               emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                         (&this_00->super_BumpAllocator,(Expression **)&local_28,this_00->errorType)
      ;
      return &pIVar4->super_Expression;
    }
  }
  func = "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
  ;
LAB_00398ed5:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                                    context);

            if (ref.kind == ExpressionKind::HierarchicalReference) {
                auto& sym = *ref.as<HierarchicalReferenceExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }